

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  GLFWmonitor **ppGVar3;
  double dVar4;
  GLFWmonitor **monitors;
  GLFWmonitor *pGStack_30;
  int monitorCount;
  GLFWmonitor *monitor;
  GLFWwindow *window;
  char **ppcStack_18;
  int count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  while( true ) {
    pGStack_30 = (GLFWmonitor *)0x0;
    if ((window._4_4_ & 1) != 0) {
      ppGVar3 = glfwGetMonitors((int *)((long)&monitors + 4));
      iVar1 = rand();
      pGStack_30 = ppGVar3[iVar1 % monitors._4_4_];
    }
    monitor = (GLFWmonitor *)open_window(0x280,0x1e0,pGStack_30);
    if (monitor == (GLFWmonitor *)0x0) break;
    glMatrixMode(0x1701);
    glOrtho(0xbff0000000000000,0,0,0);
    glMatrixMode(0x1700);
    glfwSetTime(0.0);
    while (dVar4 = glfwGetTime(), dVar4 < 5.0) {
      glClear(0x4000);
      glPushMatrix();
      dVar4 = glfwGetTime();
      glRotatef((float)dVar4 * 100.0,0,0,0x3f800000);
      glRectf(0xbf000000);
      glPopMatrix();
      glfwSwapBuffers((GLFWwindow *)monitor);
      glfwPollEvents();
      iVar1 = glfwWindowShouldClose((GLFWwindow *)monitor);
      if (iVar1 != 0) {
        close_window((GLFWwindow *)monitor);
        printf("User closed window\n");
        glfwTerminate();
        exit(0);
      }
    }
    printf("Closing window\n");
    close_window((GLFWwindow *)monitor);
    window._4_4_ = window._4_4_ + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        GLFWmonitor* monitor = NULL;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        window = open_window(640, 480, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}